

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::MergePartialFromCodedStream
          (VisionFeaturePrint_Objects *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Rep *pRVar4;
  Arena *this_01;
  char *data;
  uint uVar5;
  uint32 uVar6;
  string *value;
  Type *pTVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  this_00 = &this->output_;
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar9 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_00151e7b;
        uVar9 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar9 = uVar9 | 0x100000000;
    }
    else {
LAB_00151e7b:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
LAB_00151d4d:
      iVar8 = 7;
      if (((uVar6 & 7) != 4 && uVar6 != 0) &&
         (bVar10 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar8 = 6,
         bVar10)) goto LAB_00151d75;
    }
    else {
      uVar5 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar5 == 100) {
        if ((char)uVar9 != '\"') goto LAB_00151d4d;
        pRVar4 = (this->output_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar4 == (Rep *)0x0) {
LAB_00151d8a:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&this_00->super_RepeatedPtrFieldBase,
                     (this->output_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00151d98:
          pRVar4 = (this->output_).super_RepeatedPtrFieldBase.rep_;
          pRVar4->allocated_size = pRVar4->allocated_size + 1;
          this_01 = (this->output_).super_RepeatedPtrFieldBase.arena_;
          if (this_01 == (Arena *)0x0) {
            value = (string *)operator_new(0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
          }
          else {
            value = (string *)
                    google::protobuf::Arena::AllocateAligned
                              (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
            google::protobuf::Arena::AddListNode
                      (this_01,value,
                       google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
          }
          pRVar4 = (this->output_).super_RepeatedPtrFieldBase.rep_;
          iVar8 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
          (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
          pRVar4->elements[iVar8] = value;
        }
        else {
          iVar8 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar4->allocated_size <= iVar8) {
            if (pRVar4->allocated_size == (this->output_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_00151d8a;
            goto LAB_00151d98;
          }
          (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
          value = (string *)pRVar4->elements[iVar8];
        }
        bVar10 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
        iVar8 = 6;
        if (bVar10) {
          pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->output_).super_RepeatedPtrFieldBase.current_size_ + -1);
          data = (pTVar7->_M_dataplus)._M_p;
          pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->output_).super_RepeatedPtrFieldBase.current_size_ + -1);
          bVar10 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                             (data,(int)pTVar7->_M_string_length,PARSE,
                              "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output")
          ;
          if (bVar10) goto LAB_00151d75;
        }
        goto LAB_00151d77;
      }
      if ((uVar5 != 1) || ((char)uVar9 != '\b')) goto LAB_00151d4d;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar9 = (ulong)bVar2;
        uVar6 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_00151ea1;
        input->buffer_ = pbVar3 + 1;
        bVar10 = true;
      }
      else {
        uVar6 = 0;
LAB_00151ea1:
        uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar10 = -1 < (long)uVar9;
      }
      iVar8 = 6;
      if (bVar10) {
        this->version_ = (int)uVar9;
LAB_00151d75:
        iVar8 = 0;
      }
    }
LAB_00151d77:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool VisionFeaturePrint_Objects::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_version(static_cast< ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string output = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_output()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->output(this->output_size() - 1).data(),
            this->output(this->output_size() - 1).length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  return false;
#undef DO_
}